

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_stats.cpp
# Opt level: O2

int __thiscall libtorrent::find_metric_idx(libtorrent *this,string_view name)

{
  bool bVar1;
  long lVar2;
  libtorrent *local_28;
  size_t local_20;
  
  local_20 = name._M_len;
  lVar2 = 0;
  local_28 = this;
  do {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_28,
                         (stats_metric_impl *)((long)&(anonymous_namespace)::metrics + lVar2));
    if (lVar2 == 0x1200) {
      lVar2 = 0x1200;
      if (!bVar1) {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
                ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                              *)&local_28,(stats_metric_impl *)&PTR_anon_var_dwarf_cc5935_004ce180);
        lVar2 = 0x1210;
        if (!bVar1) {
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
                  ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                                *)&local_28,(stats_metric_impl *)&PTR_anon_var_dwarf_cc5941_004ce190
                              );
          lVar2 = 0x1220;
          if (!bVar1) {
            return -1;
          }
        }
      }
LAB_002be0d6:
      return *(int *)((long)&DAT_004ccf78 + lVar2);
    }
    if (bVar1) goto LAB_002be0d6;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_28,
                         (stats_metric_impl *)((long)&PTR_anon_var_dwarf_cc4b9d_004ccf80 + lVar2));
    if (bVar1) {
      lVar2 = lVar2 + 0x10;
      goto LAB_002be0d6;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_28,
                         (stats_metric_impl *)((long)&PTR_anon_var_dwarf_cc4bb3_004ccf90 + lVar2));
    if (bVar1) {
      lVar2 = lVar2 + 0x20;
      goto LAB_002be0d6;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_28,
                         (stats_metric_impl *)((long)&PTR_anon_var_dwarf_cc4bc9_004ccfa0 + lVar2));
    if (bVar1) {
      if (lVar2 == 0x1200) {
        return -1;
      }
      lVar2 = lVar2 + 0x30;
      goto LAB_002be0d6;
    }
    lVar2 = lVar2 + 0x40;
  } while( true );
}

Assistant:

int find_metric_idx(string_view name)
	{
		auto const i = std::find_if(std::begin(metrics), std::end(metrics)
			, [name](stats_metric_impl const& metr)
			{ return metr.name == name; });

		if (i == std::end(metrics)) return -1;
		return i->value_index;
	}